

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnEnum<short>::ColumnEnum
          (ColumnEnum<short> *this,TypeRef *type,vector<short,_std::allocator<short>_> *data)

{
  shared_ptr<clickhouse::Type> *in_RDI;
  vector<short,_std::allocator<short>_> *in_stack_00000008;
  vector<short,_std::allocator<short>_> *in_stack_00000010;
  TypeRef *in_stack_ffffffffffffffc8;
  Column *in_stack_ffffffffffffffd0;
  shared_ptr<clickhouse::Type> local_28 [2];
  
  std::shared_ptr<clickhouse::Type>::shared_ptr(local_28,in_RDI);
  Column::Column(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x1f8e55);
  (in_RDI->super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__ColumnEnum_0029fb70;
  std::vector<short,_std::allocator<short>_>::vector(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

ColumnEnum<T>::ColumnEnum(TypeRef type, const std::vector<T>& data)
    : Column(type)
    , data_(data)
{
}